

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O3

void cast_verify::TestDouble(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  bool *pbVar4;
  CastTest<double> tests [5];
  CastTest<double> local_88 [5];
  
  InitializeCastArray<double>(local_88,5);
  pbVar4 = &local_88[0].fExpected;
  lVar3 = 0;
  do {
    dVar1 = ((CastTest<double> *)(pbVar4 + -8))->x;
    if (((0x7fefffffffffffff < (ulong)ABS(dVar1)) || (dVar1 < 0.0)) ||
       (1.844674407370955e+19 < dVar1)) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (*pbVar4 != true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error in cast double to std::uint64_t case ",0x2b);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
    pbVar4 = pbVar4 + 0x10;
  } while (lVar3 != 5);
  return;
}

Assistant:

void TestDouble()
	{
		CastTest<double> tests[5];

		InitializeCastArray(tests, _countof(tests));

		for (unsigned i = 0; i < _countof(tests); ++i)
		{
			SafeInt<std::uint64_t> test;
			bool fSuccess;

			try
			{
				test = tests[i].x;
				fSuccess = true;
			}
			catch (...)
			{
				fSuccess = false;
			}

			if(fSuccess != tests[i].fExpected)
				std::cerr << "Error in cast double to std::uint64_t case " << i << std::endl;
		}
	}